

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-parser.cc
# Opt level: O2

void __thiscall GenParser::visit(GenParser *this,Symbol *sym)

{
  IRBuilder *this_00;
  BasicBlock *pBVar1;
  Name *pNVar2;
  Temp *target;
  Result *pRVar3;
  double __x;
  allocator<char> local_69;
  string local_68;
  string local_48 [32];
  
  this_00 = &this->super_IRBuilder;
  if (sym->isTerminal == true) {
    pBVar1 = IR::IRBuilder::newBasicBlock(this_00);
    pNVar2 = IR::IRBuilder::getName(this_00,sym);
    IR::IRBuilder::cjump
              (this_00,&pNVar2->super_Expr,pBVar1,(this->super_CodeGenerator).code.iffalse);
    IR::IRBuilder::place(this_00,pBVar1);
    std::__cxx11::string::string<std::allocator<char>>(local_48,"yyconsume()",&local_69);
    IR::IRBuilder::exp(this_00,__x);
    pRVar3 = &(this->super_CodeGenerator).code;
    std::__cxx11::string::~string(local_48);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    target = IR::IRBuilder::newTemp(this_00,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    IR::IRBuilder::save(this_00,target);
    pBVar1 = IR::IRBuilder::newBasicBlock(this_00);
    pNVar2 = IR::IRBuilder::getName(this_00,sym);
    IR::IRBuilder::cjump(this_00,&pNVar2->super_Expr,(this->super_CodeGenerator).code.iftrue,pBVar1)
    ;
    IR::IRBuilder::place(this_00,pBVar1);
    IR::IRBuilder::restore(this_00,target);
    pRVar3 = (Result *)&(this->super_CodeGenerator).code.iffalse;
  }
  IR::IRBuilder::jump(this_00,pRVar3->iftrue);
  return;
}

Assistant:

void GenParser::visit(ast::Symbol* sym) {
  if (sym->isTerminal) {
    auto iftrue = newBasicBlock();

    cjump(getName(sym), iftrue, code.iffalse);
    place(iftrue);
    exp("yyconsume()");
    jump(code.iftrue);
    return;
  }

  auto temp = newTemp();
  save(temp);

  auto iffalse = newBasicBlock();

  cjump(getName(sym), code.iftrue, iffalse);

  place(iffalse);
  restore(temp);
  jump(code.iffalse);
}